

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_md5(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_val_t *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  char hash [33];
  size_t len;
  CVmNativeCodeDesc *in_stack_ffffffffffffff88;
  uint *in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  
  if ((getp_md5(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_md5(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_md5::desc,0);
    __cxa_guard_release(&getp_md5(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (iVar1 == 0) {
    vmb_get_len((char *)0x390779);
    md5_ez((char *)hash._0_8_,in_stack_00000008,unaff_retaddr);
    obj = create(in_stack_ffffffffffffffa4,(char *)in_stack_ffffffffffffff98,(size_t)in_RDI);
    vm_val_t::set_obj(in_RDI,obj);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_md5(VMG_ vm_val_t *retval,
                           const vm_val_t *self_val,
                           const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* calculate the hash */
    char hash[33];
    md5_ez(hash, str, len);

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, hash, 32));

    /* done */
    return TRUE;
}